

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

const_iterator __thiscall
VulkanHppGenerator::findAlias
          (VulkanHppGenerator *this,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
          *aliases)

{
  __type_conflict _Var1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>
  __x;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>
  _Var2;
  _Rb_tree_header *p_Var3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
  pStack_78;
  
  __x._M_node = (aliases->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(aliases->_M_t)._M_impl.super__Rb_tree_header;
  while( true ) {
    if ((_Rb_tree_header *)__x._M_node == p_Var3) {
      return (const_iterator)__x._M_node;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
              (&pStack_78,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                *)(__x._M_node + 1));
    _Var1 = std::operator==(&pStack_78.second.name,name);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
    ::~pair(&pStack_78);
    if (_Var1) break;
    __x._M_node = (_Base_ptr)std::_Rb_tree_increment(__x._M_node);
  }
  _Var2 = std::
          next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                    (__x,1);
  while( true ) {
    if ((_Rb_tree_header *)_Var2._M_node == p_Var3) {
      return (const_iterator)__x._M_node;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
              (&pStack_78,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                *)(_Var2._M_node + 1));
    _Var1 = std::operator==(&pStack_78.second.name,name);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
    ::~pair(&pStack_78);
    if (_Var1) break;
    _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
  }
  __assert_fail("( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda )",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x81a,
                "std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias(const std::string &, const std::map<std::string, NameLine> &) const"
               );
}

Assistant:

std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias( std::string const &                     name,
                                                                                                   std::map<std::string, NameLine> const & aliases ) const
{
  auto lambda = [&name]( std::pair<std::string, NameLine> const & ad ) { return ad.second.name == name; };
  auto it     = std::ranges::find_if( aliases, lambda );
  assert( ( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda ) );
  return it;
}